

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O2

void __thiscall SkipList::Print(SkipList *this)

{
  Node *pNVar1;
  Node *pNVar2;
  ostream *poVar3;
  Node *pNVar4;
  int iVar5;
  
  iVar5 = this->height;
  while (pNVar1 = this->header, pNVar1 != (Node *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    std::operator<<(poVar3,"] - ");
    pNVar2 = pNVar1;
    while (pNVar4 = pNVar2, pNVar4 != (Node *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"{ ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pNVar4->key);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&pNVar4->val);
      std::operator<<(poVar3," }");
      pNVar2 = (Node *)0x0;
      if (pNVar4->next != (Node *)0x0) {
        std::operator<<((ostream *)&std::cout,", ");
        pNVar2 = pNVar4->next;
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
    iVar5 = iVar5 + -1;
    this = (SkipList *)&pNVar1->bot;
  }
  return;
}

Assistant:

void SkipList::Print() const
{
	Node* head = header;
	int lvl = height;
	while(head)
	{
		std::cout << "\n[" << lvl << "] - ";
		Node* node = head;
		while(node)
		{
			std::cout << "{ " << node->key << " " << node->val << " }";
			if (node->next)
			{
				std::cout << ", ";
			}
			node = node->next;
		}
		std::cout << "\n";
		head = head->bot;
		lvl--;
	}
}